

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

bool __thiscall helics::Federate::isAsyncOperationCompleted(Federate *this)

{
  Modes MVar1;
  bool bVar2;
  future_status fVar3;
  long in_RDI;
  shared_handle asyncInfo;
  future_status ready;
  seconds wait_delay;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_38;
  future_status local_1c;
  undefined8 local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    local_18 = 0;
    local_1c = ready;
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x207102);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock_shared
              ((shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff8f,
                        CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    MVar1 = std::atomic<helics::Federate::Modes>::load
                      ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
    switch(MVar1) {
    case PENDING_INIT:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      fVar3 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<bool> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      local_1 = fVar3 == local_1c;
      break;
    case PENDING_EXEC:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      fVar3 = std::__basic_future<helics::iteration_time>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<helics::iteration_time> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      local_1 = fVar3 == local_1c;
      break;
    case PENDING_TIME:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      fVar3 = std::__basic_future<TimeRepresentation<count_time<9,long>>>::
              wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<TimeRepresentation<count_time<9,_long>_>_> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      local_1 = fVar3 == local_1c;
      break;
    case PENDING_ITERATIVE_TIME:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      fVar3 = std::__basic_future<helics::iteration_time>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<helics::iteration_time> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      local_1 = fVar3 == local_1c;
      break;
    case PENDING_FINALIZE:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      fVar3 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<void> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      local_1 = fVar3 == local_1c;
      break;
    default:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      bVar2 = std::function::operator_cast_to_bool((function<bool_()> *)0x2072f2);
      if (bVar2) {
        gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                  (&local_38);
        local_1 = std::function<bool_()>::operator()
                            ((function<bool_()> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      else {
        local_1 = false;
      }
      break;
    case PENDING_ITERATIVE_INIT:
      gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                (&local_38);
      fVar3 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<void> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT17(in_stack_ffffffffffffff8f,
                                  CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      local_1 = fVar3 == local_1c;
    }
    gmlc::libguarded::shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~shared_lock_handle
              ((shared_lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x207345);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Federate::isAsyncOperationCompleted() const
{
    if (singleThreadFederate) {
        return false;
    }
    constexpr std::chrono::seconds wait_delay{0};
    auto ready = std::future_status::ready;

    auto asyncInfo = asyncCallInfo->lock_shared();
    switch (currentMode.load()) {
        case Modes::PENDING_INIT:
            return (asyncInfo->initFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_EXEC:
            return (asyncInfo->execFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_TIME:
            return (asyncInfo->timeRequestFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_ITERATIVE_TIME:
            return (asyncInfo->timeRequestIterativeFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_FINALIZE:
            return (asyncInfo->finalizeFuture.wait_for(wait_delay) == ready);
        case Modes::PENDING_ITERATIVE_INIT:
            return (asyncInfo->initIterativeFuture.wait_for(wait_delay) == ready);
        default:
            return (asyncInfo->asyncCheck) ? asyncInfo->asyncCheck() : false;
    }
}